

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# difference_iterator.hpp
# Opt level: O0

void __thiscall
burst::
difference_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Rb_tree_const_iterator<int>,_std::less<void>_>
::maintain_invariant
          (difference_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Rb_tree_const_iterator<int>,_std::less<void>_>
           *this)

{
  bool bVar1;
  reference piVar2;
  reference piVar3;
  byte local_19;
  difference_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Rb_tree_const_iterator<int>,_std::less<void>_>
  *this_local;
  
  while( true ) {
    bVar1 = std::operator!=(&this->m_subtrahend_begin,&this->m_subtrahend_end);
    local_19 = 0;
    if (bVar1) {
      bVar1 = __gnu_cxx::operator!=(&this->m_minuend_begin,&this->m_minuend_end);
      local_19 = 0;
      if (bVar1) {
        piVar3 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                 ::operator*(&this->m_minuend_begin);
        piVar2 = std::_Rb_tree_const_iterator<int>::operator*(&this->m_subtrahend_begin);
        bVar1 = (((std::forward<int_const&>)({parm#1}))<((std::forward<int_const&>)({parm#2})))std::
                less<void>::operator()(&this->field_0x20,piVar3,piVar2);
        local_19 = bVar1 ^ 0xff;
      }
    }
    if ((local_19 & 1) == 0) break;
    piVar2 = std::_Rb_tree_const_iterator<int>::operator*(&this->m_subtrahend_begin);
    piVar3 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*(&this->m_minuend_begin);
    bVar1 = (((std::forward<int_const&>)({parm#1}))<((std::forward<int_const&>)({parm#2})))std::
            less<void>::operator()(&this->field_0x20,piVar2,piVar3);
    if (!bVar1) {
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&this->m_minuend_begin);
      std::_Rb_tree_const_iterator<int>::operator++(&this->m_subtrahend_begin);
    }
    drop_subtrahend_head(this);
  }
  return;
}

Assistant:

void maintain_invariant ()
        {
            while (m_subtrahend_begin != m_subtrahend_end
                && m_minuend_begin != m_minuend_end
                && not m_compare(*m_minuend_begin, *m_subtrahend_begin))
            {
                if (not m_compare(*m_subtrahend_begin, *m_minuend_begin))
                {
                    ++m_minuend_begin;
                    ++m_subtrahend_begin;
                }
                drop_subtrahend_head();
            }
        }